

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_get_dates(uchar **p,uchar *end,mbedtls_x509_time *from,mbedtls_x509_time *to)

{
  int iVar1;
  uchar *end_00;
  size_t local_30;
  size_t len;
  
  iVar1 = mbedtls_asn1_get_tag(p,end,&local_30,0x30);
  if (iVar1 == 0) {
    end_00 = *p + local_30;
    iVar1 = mbedtls_x509_get_time(p,end_00,from);
    if (iVar1 == 0) {
      iVar1 = mbedtls_x509_get_time(p,end_00,to);
      if ((iVar1 == 0) && (iVar1 = -0x2466, *p == end_00)) {
        iVar1 = 0;
      }
    }
  }
  else {
    iVar1 = iVar1 + -0x2400;
  }
  return iVar1;
}

Assistant:

static int x509_get_dates(unsigned char **p,
                          const unsigned char *end,
                          mbedtls_x509_time *from,
                          mbedtls_x509_time *to)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE, ret);
    }

    end = *p + len;

    if ((ret = mbedtls_x509_get_time(p, end, from)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_x509_get_time(p, end, to)) != 0) {
        return ret;
    }

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}